

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O2

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_4
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  precompute_matrix *ppVar1;
  size_type stop;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  pointer puVar9;
  R10_Decoder *pRVar10;
  size_type stop_00;
  ulong stop_01;
  pointer puVar11;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *puVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  ulong local_298;
  long local_268;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  group_col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> match_pos;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  for_xor;
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_200;
  ulong local_1d8;
  pointer local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonZeros_pos;
  precompute_matrix *local_1a0;
  ulong local_198;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_190;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  U_upper;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  undefined1 local_120 [48];
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a8;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  dVar15 = ceil((double)this->A_u * 0.125);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)&nonZeros_pos,0,(ulong)this->A_i);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)&group_col,(ulong)this->A_i,(ulong)D->L);
  boost::numeric::ublas::
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::matrix_range(&local_200,A,(range_type *)&nonZeros_pos,(range_type *)&group_col);
  boost::numeric::ublas::
  matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  ::
  matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
            ((matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              *)&U_upper,
             (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_200);
  nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::numeric::ublas::
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::vector(&group_col,8);
  uVar3 = (int)(long)dVar15 - 1;
  ppVar1 = &this->precomput_param;
  local_298 = 0;
  uVar6 = 0;
  while (uVar6 != uVar3) {
    local_1d0 = (pointer)(local_298 << 5);
    stop = uVar6 * 8 + 8;
    puVar9 = (pointer)0x0;
    local_1d8 = uVar6;
    while( true ) {
      if (U_upper.size1_ <= puVar9) break;
      match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&U_upper;
      match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9;
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&for_xor,uVar6 * 8,stop);
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_200,(vector_type *)&match_pos,
                     (basic_range<unsigned_long,_long> *)&for_xor);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&group_col.data_,
                  (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)&local_200);
      pRVar10 = (R10_Decoder *)&stack0xffffffffffffffb8;
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffffb8,&group_col.data_);
      uVar4 = nonZeros_In_Row(pRVar10,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&stack0xffffffffffffffb8,0,(int)group_col.data_.size_ - 1);
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &stack0xffffffffffffffb8);
      pRVar10 = (R10_Decoder *)&group_col;
      if (uVar4 != 0) {
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        unbounded_array(&local_60,
                        (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar10);
        find_nonZeros_pos_In_Row
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200,pRVar10,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_60,0,(int)group_col.data_.size_ - 1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  (&nonZeros_pos,&local_200);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200);
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        ~unbounded_array(&local_60);
        match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        puVar11 = local_1d0;
        uVar14 = local_298;
        while( true ) {
          pRVar10 = (R10_Decoder *)&group_col;
          if ((int)uVar6 * 0xff + 0xff <= uVar14) break;
          for_xor.data_._0_8_ = ppVar1;
          for_xor.data_.size_ = uVar14;
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_190,uVar6 * 8,stop);
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_200,(vector_type *)&for_xor,(range_type *)&local_190);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)pRVar10,
                      (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)&local_200);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          unbounded_array(&local_78,
                          (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar10)
          ;
          stop_00 = 7;
          find_nonZeros_pos_In_Row
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200,pRVar10,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_78,0,7);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     &local_200);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          ~unbounded_array(&local_78);
          bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &match_pos.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                                  &nonZeros_pos);
          if (bVar2) {
            local_200.data_.e_ = A;
            local_200.r1_.start_ = (size_type)puVar9;
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&for_xor,
                       (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_200);
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      (&local_190,(ublas *)&for_xor,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(ulong)this->A_i,(ulong)D->L,stop_00);
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_150,
                       (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_190);
            local_1a0 = ppVar1;
            local_198 = uVar14;
            boost::numeric::ublas::
            vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
            ::
            vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_90,
                       (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&local_1a0);
            Utility::matrix_row_XOR
                      ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_200,&this->util,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_150,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_90);
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                      (&local_a8,(ublas *)&for_xor,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)(ulong)this->A_i,(ulong)D->L,stop_00);
            boost::numeric::ublas::
            vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                         *)&local_a8,
                        (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_200);
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &local_200);
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            ~unbounded_array(&local_90);
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            ~unbounded_array(&local_150);
            local_200.data_.e_ = A;
            local_200.r1_.start_ = (size_type)puVar9;
            boost::numeric::ublas::
            matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
            ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                         *)&local_200,
                        (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&for_xor);
            Vector_Data_DEF::operator^
                      ((Vector_Data_DEF *)&local_200,
                       (D->symbol).
                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl
                       .super__Vector_impl_data._M_start +
                       (this->d).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)puVar9],
                       (Vector_Data_DEF *)
                       ((long)&(((this->precomput_param).D_p.symbol.
                                 super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->s).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + (long)puVar11));
            Vector_Data_DEF::operator=
                      ((D->symbol).
                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl
                       .super__Vector_impl_data._M_start +
                       (this->d).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)puVar9],
                       (Vector_Data_DEF *)&local_200);
            Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_200);
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            ~unbounded_array(&for_xor.data_);
          }
          uVar14 = uVar14 + 1;
          puVar11 = puVar11 + 8;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      puVar9 = (pointer)((long)puVar9 + 1);
    }
    local_298 = (ulong)((int)local_298 + 0xff);
    uVar6 = local_1d8 + 1;
  }
  uVar5 = uVar3 * 0xff;
  uVar7 = uVar3 * 8;
  uVar6 = (ulong)uVar7;
  uVar14 = (ulong)(uVar3 * 8 + 8);
  local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,uVar5 - 1);
  local_1d8 = CONCAT44(local_1d8._4_4_,uVar5 + 0xff);
  for (puVar9 = (pointer)0x0; puVar9 < U_upper.size1_; puVar9 = (pointer)((long)puVar9 + 1)) {
    match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&U_upper;
    uVar3 = this->A_u & 7;
    match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
    if (uVar3 == 0) {
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&for_xor.data_,uVar6,uVar14);
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_200,(vector_type *)&match_pos,(range_type *)&for_xor.data_);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&group_col,
                  (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)&local_200);
    }
    else {
      boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                ((basic_range<unsigned_long,_long> *)&for_xor.data_,uVar6,(ulong)(uVar3 | uVar7));
      boost::numeric::ublas::
      vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_200,(vector_type *)&match_pos,(range_type *)&for_xor.data_);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                   *)&group_col,
                  (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)&local_200);
    }
    pRVar10 = (R10_Decoder *)local_120;
    boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
    unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,
                    &group_col.data_);
    uVar4 = nonZeros_In_Row(pRVar10,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)local_120,0,(int)group_col.data_.size_ - 1);
    boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
    ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_120);
    pRVar10 = (R10_Decoder *)&group_col;
    if (uVar4 != 0) {
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      unbounded_array(&local_c0,
                      (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar10);
      find_nonZeros_pos_In_Row
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200,pRVar10,
                 (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_c0,0,(int)group_col.data_.size_ - 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&nonZeros_pos,&local_200);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200);
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      ~unbounded_array(&local_c0);
      match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar8 = this->A_u & 7;
      uVar3 = (1 << (sbyte)uVar8) + (int)local_1d0;
      if (uVar8 == 0) {
        uVar3 = (uint)local_1d8;
      }
      uVar13 = (ulong)uVar5;
      local_268 = (ulong)uVar5 << 5;
      while( true ) {
        pRVar10 = (R10_Decoder *)&group_col;
        if (uVar3 <= uVar13) break;
        uVar8 = this->A_u & 7;
        for_xor.data_.size_ = uVar13;
        if (uVar8 == 0) {
          for_xor.data_._0_8_ = ppVar1;
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_190,uVar6,uVar14);
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_200,(vector_type *)&for_xor.data_,(range_type *)&local_190);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)pRVar10,
                      (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)&local_200);
        }
        else {
          for_xor.data_._0_8_ = ppVar1;
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_190,uVar6,(ulong)(uVar8 | uVar7));
          boost::numeric::ublas::
          vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::vector_range((vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_200,(vector_type *)&for_xor.data_,(range_type *)&local_190);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)pRVar10,
                      (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)&local_200);
        }
        if ((this->A_u & 7) == 0) {
          puVar12 = &local_d8;
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          unbounded_array(puVar12,(unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  pRVar10);
          stop_01 = 7;
          find_nonZeros_pos_In_Row
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200,pRVar10,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)puVar12,0,7);
        }
        else {
          puVar12 = &local_f0;
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          unbounded_array(puVar12,(unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  pRVar10);
          uVar8 = (this->A_u & 7) - 1;
          stop_01 = (ulong)uVar8;
          find_nonZeros_pos_In_Row
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200,pRVar10,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)puVar12,0,uVar8);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                   &local_200);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_200);
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        ~unbounded_array(puVar12);
        bVar2 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &match_pos.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                                &nonZeros_pos);
        if (bVar2) {
          local_200.data_.e_ = A;
          local_200.r1_.start_ = (size_type)puVar9;
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)&for_xor.data_,
                     (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_200);
          boost::numeric::ublas::
          subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_190,(ublas *)&for_xor.data_,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(ulong)this->A_i,(ulong)D->L,stop_01);
          puVar12 = (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                    (local_120 + 0x18);
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)puVar12,
                     (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_190);
          local_1a0 = ppVar1;
          local_198 = uVar13;
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::
          vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                    ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_138,
                     (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&local_1a0);
          Utility::matrix_row_XOR
                    ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_200,&this->util,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)puVar12,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_138);
          boost::numeric::ublas::
          subrange<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_a8,(ublas *)&for_xor.data_,
                     (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(ulong)this->A_i,(ulong)D->L,stop_01);
          boost::numeric::ublas::
          vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
          ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                       *)&local_a8,
                      (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_200);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &local_200);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          ~unbounded_array(&local_138);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          ~unbounded_array(puVar12);
          local_200.data_.e_ = A;
          local_200.r1_.start_ = (size_type)puVar9;
          boost::numeric::ublas::
          matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
          ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                       *)&local_200,
                      (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&for_xor.data_);
          Vector_Data_DEF::operator^
                    ((Vector_Data_DEF *)&local_200,
                     (D->symbol).
                     super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     (this->d).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)puVar9],
                     (Vector_Data_DEF *)
                     ((long)&(((this->precomput_param).D_p.symbol.
                               super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                               ._M_impl.super__Vector_impl_data._M_start)->s).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + local_268));
          Vector_Data_DEF::operator=
                    ((D->symbol).
                     super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     (this->d).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)puVar9],
                     (Vector_Data_DEF *)&local_200);
          Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_200);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          ~unbounded_array(&for_xor.data_);
        }
        uVar13 = uVar13 + 1;
        local_268 = local_268 + 0x20;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&match_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  Array_Data_Symbol::operator=(__return_storage_ptr__,D);
  boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
  ~unbounded_array(&group_col.data_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
  ~unbounded_array(&U_upper.data_);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_4(matrix<uint8_t> &A, class Array_Data_Symbol &D,  uint32_t &M)
{

	/*
	For each of the first i rows of A, for each group of 8 columns in the
   U_upper submatrix of this row, if the set of 8 column entries in
   U_upper are not all zero, then the row of the precomputation matrix
   U' that matches the pattern in the 8 columns is exclusive-ORed into
   the row, thus zeroing out those 8 columns in the row at the cost of
   exclusive-ORing one row of U' into the row.
	
	*/

	class Array_Data_Symbol result;

	uint32_t groups_num = std::ceil(A_u / 8.0);

	uint32_t nonZeros = 0;

	ublas::matrix<uint8_t> U_upper =  ublas::project(A, range(0, A_i), range(A_i, D.L));

	std::vector<uint32_t> nonZeros_pos;
	nonZeros_pos.clear();

	ublas::vector<uint8_t> group_col(8);



	// for (int i = 0; i < U_upper.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < U_upper.size2(); j++)
	// 	{
	// 		printf("%d ",  U_upper(i, j));  
	// 	}
	// 	printf("\n");
	// }

	//groups_num = 1;
	uint32_t _row = 0;
	for (int i = 0; i < groups_num - 1; i++)
	{


		_row = i * 255;
		for (int j = 0; j < U_upper.size1(); j++)
		{

			group_col = ublas::project(ublas::row(U_upper, j), range(8 * i, 8 * i + 8));

			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

			nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
		//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

			if (nonZeros == 0)
			{
				continue;
			}


		//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

			nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

			// for (int k = 0; k < nonZeros_pos.size(); k++)
			// {
			// 	std::cout << "  " << nonZeros_pos[k];
			// }
			// std::cout << std::endl;


		//	std::cout << "match_pos: " << std::endl;
			std::vector<uint32_t> match_pos;
			//	printf(" %d \n", _row);
			uint32_t orig_row = _row;
			while(_row < 255 * (i + 1))
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * i, 8 * i + 8));

//				match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * i, 8 * i + 8 - 1);
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);
				


				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				//std::cout << std::endl;

				if (match_pos == nonZeros_pos)
				{
			//		std::cout << "match_pos == nonZeros_pos" << std::endl;
					// for (int k = 0; k < nonZeros_pos.size(); k++)
					// {
					// 	std::cout << "  " << nonZeros_pos[k];
					// }
					// std::cout << std::endl;

					// for (int k = 0; k < match_pos.size(); k++)
					// {
					// 	printf(" %d ", match_pos[k]);
					// }
					// std::cout << std::endl;


					ublas::vector<uint8_t> for_xor = ublas::row(A, j);
					 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
					//exit(0);
					 D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				}
				// the _row can increase after matching.
				_row++;

			}
			_row = orig_row;


		//	std::cout << std::endl;
		}
		
	}

				


	// last group handle
	//std::cout << "last group handle: " << std::endl;


	_row = (groups_num - 1) * 255;
	for (int j = 0; j < U_upper.size1(); j++)
	{

		if (A_u % 8 == 0)
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + 8));
		}
		else
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8));
		}
		

		// for (int k = 0; k < group_col.size(); k++)
		// {
		// 	printf(" %d ", group_col(k));
		// }
		// std::cout << std::endl;
	



		nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
	//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

		if (nonZeros == 0)
		{
			continue;
		}

			

	//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

		nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

		// for (int k = 0; k < nonZeros_pos.size(); k++)
		// {
		// 	std::cout << " " << nonZeros_pos[k];
		// }
		// std::cout << std::endl;



	//	std::cout << "match_pos: " << std::endl;
		std::vector<uint32_t> match_pos;
		//	printf(" %d \n", _row);
		uint32_t orig_row = _row;


		uint32_t last_group_condition = 255 * (groups_num - 1) + (1 << A_u % 8) - 1;

		if (A_u % 8 == 0)
		{
			last_group_condition = 255 * (groups_num - 1) + 255;
		}

		uint32_t chosen_col = 0;

	//	std::cout << "last_group_condition: " << last_group_condition << std::endl;

		//while(_row < 255 * (groups_num - 1) + (1 << A_u % 8) - 1 )
		while(_row < last_group_condition)
		{





			if (A_u % 8 == 0)
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + 8));
			}
			else
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + A_u % 8));

			}


			//match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8 - 1);

			if (A_u % 8 == 0)
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);

			}
			else
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, A_u % 8 - 1);

			}


			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

				// for (int k = 0; k < precomput_param.U_p.size2(); k++)
				// {
				// 	printf(" %d ", precomput_param.U_p(_row,k));
					
				// }

				//std::cout << A_u % 8 - 1 << std::endl;


			// for (int k = 0; k < match_pos.size(); k++)
			// {
			// 	printf(" %d ", match_pos[k]);
			// }
			// std::cout << std::endl;




	//		std::cout << "_row: "<< _row << std::endl;

			if (match_pos == nonZeros_pos)
			{

				// std::cout << "match_pos == nonZeros_pos" << std::endl;


				// for (int k = 0; k < nonZeros_pos.size(); k++)
				// {
				// 	std::cout << "  " << nonZeros_pos[k];
				// }
				// std::cout << std::endl;

				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				// std::cout << std::endl;


				ublas::vector<uint8_t> for_xor = ublas::row(A, j);
				 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
				
				D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				

			}
			_row++;


		}
		_row = orig_row;


//		std::cout << std::endl;
	}

	// for (int i = 0; i < precomput_param.U_p.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < precomput_param.U_p.size2(); j++)
	// 	{
	// 		printf("%d ",  precomput_param.U_p(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	// for (int i = 0; i < A.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < A.size2(); j++)
	// 	{
	// 		printf("%d ",  A(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	result = D;


	return result;
}